

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imsg-buffer.c
# Opt level: O2

void * ibuf_reserve(ibuf *buf,size_t len)

{
  int iVar1;
  size_t sVar2;
  ulong uVar3;
  
  sVar2 = buf->wpos;
  uVar3 = sVar2 + len;
  if (buf->size < uVar3) {
    iVar1 = ibuf_realloc(buf,len);
    if (iVar1 == -1) {
      return (void *)0x0;
    }
    sVar2 = buf->wpos;
    uVar3 = len + sVar2;
  }
  buf->wpos = uVar3;
  return buf->buf + sVar2;
}

Assistant:

void *
ibuf_reserve(struct ibuf *buf, size_t len)
{
	void	*b;

	if (buf->wpos + len > buf->size)
		if (ibuf_realloc(buf, len) == -1)
			return (NULL);

	b = buf->buf + buf->wpos;
	buf->wpos += len;
	return (b);
}